

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_status pugi::impl::anon_unknown_0::get_file_size(FILE *file,size_t *out_result)

{
  int iVar1;
  undefined1 local_b0 [4];
  xml_parse_status status;
  stat st;
  size_t *out_result_local;
  FILE *file_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)out_result;
  iVar1 = fileno((FILE *)file);
  iVar1 = fstat(iVar1,(stat *)local_b0);
  if (iVar1 == 0) {
    if (((uint)st.st_nlink & 0xf000) == 0x8000) {
      file_local._4_4_ = convert_file_size<long>(st.st_rdev,(size_t *)st.__glibc_reserved[2]);
    }
    else {
      file_local._4_4_ = status_io_error;
    }
  }
  else {
    file_local._4_4_ = status_io_error;
  }
  return file_local._4_4_;
}

Assistant:

PUGI_IMPL_FN xml_parse_status get_file_size(FILE* file, size_t& out_result)
	{
	#if defined(__linux__) || defined(__APPLE__)
		// this simultaneously retrieves the file size and file mode (to guard against loading non-files)
		struct stat st;
		if (fstat(fileno(file), &st) != 0) return status_io_error;

		// anything that's not a regular file doesn't have a coherent length
		if (!S_ISREG(st.st_mode)) return status_io_error;

		xml_parse_status status = convert_file_size(st.st_size, out_result);
	#elif defined(PUGI_IMPL_MSVC_CRT_VERSION) && PUGI_IMPL_MSVC_CRT_VERSION >= 1400
		// there are 64-bit versions of fseek/ftell, let's use them
		_fseeki64(file, 0, SEEK_END);
		__int64 length = _ftelli64(file);
		_fseeki64(file, 0, SEEK_SET);

		xml_parse_status status = convert_file_size(length, out_result);
	#elif defined(__MINGW32__) && !defined(__NO_MINGW_LFS) && (!defined(__STRICT_ANSI__) || defined(__MINGW64_VERSION_MAJOR))
		// there are 64-bit versions of fseek/ftell, let's use them
		fseeko64(file, 0, SEEK_END);
		off64_t length = ftello64(file);
		fseeko64(file, 0, SEEK_SET);

		xml_parse_status status = convert_file_size(length, out_result);
	#else
		// if this is a 32-bit OS, long is enough; if this is a unix system, long is 64-bit, which is enough; otherwise we can't do anything anyway.
		fseek(file, 0, SEEK_END);
		long length = ftell(file);
		fseek(file, 0, SEEK_SET);

		xml_parse_status status = convert_file_size(length, out_result);
	#endif

		return status;
	}